

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O3

void xmlInitRandom(void)

{
  int iVar1;
  int *piVar2;
  time_t tVar3;
  int var;
  undefined1 local_1c [4];
  
  xmlInitMutex(&xmlRngMutex);
  iVar1 = getentropy(globalRngState,8);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    do {
      if (*piVar2 != 4) {
        if (*piVar2 == 0x26) {
          tVar3 = time((time_t *)0x0);
          globalRngState[0] = (uint)tVar3 ^ 0x1289da00;
          globalRngState[1] = ((uint)local_1c << 0x18 | (uint)local_1c >> 8) ^ 0x2b700021;
          return;
        }
        xmlAbort("libxml2: getentropy failed with error code %d\n");
      }
      iVar1 = getentropy(globalRngState,8);
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
void
xmlInitRandom(void) {
    xmlInitMutex(&xmlRngMutex);

    {
#ifdef _WIN32
        NTSTATUS status;

        /*
         * You can find many (recent as of 2025) discussions how
         * to get a pseudo-random seed on Windows in projects like
         * Golang, Rust, Chromium and Firefox.
         *
         * TODO: Support ProcessPrng available since Windows 10.
         */
        status = BCryptGenRandom(NULL, (unsigned char *) globalRngState,
                                 sizeof(globalRngState),
                                 BCRYPT_USE_SYSTEM_PREFERRED_RNG);
        if (!BCRYPT_SUCCESS(status))
            xmlAbort("libxml2: BCryptGenRandom failed with error code %lu\n",
                     GetLastError());
#else
        int var;

#if HAVE_DECL_GETENTROPY
        while (1) {
            if (getentropy(globalRngState, sizeof(globalRngState)) == 0)
                return;

            /*
             * This most likely means that libxml2 was compiled on
             * a system supporting certain system calls and is running
             * on a system that doesn't support these calls, as can
             * be the case on Linux.
             */
            if (errno == ENOSYS)
                break;

            /*
             * We really don't want to fallback to the unsafe PRNG
             * for possibly accidental reasons, so we abort on any
             * unknown error.
             */
            if (errno != EINTR)
                xmlAbort("libxml2: getentropy failed with error code %d\n",
                         errno);
        }
#endif

        /*
         * TODO: Fallback to /dev/urandom for older POSIX systems.
         */
        globalRngState[0] =
                (unsigned) time(NULL) ^
                HASH_ROL((unsigned) ((size_t) &xmlInitRandom & 0xFFFFFFFF), 8);
        globalRngState[1] =
                HASH_ROL((unsigned) ((size_t) &xmlRngMutex & 0xFFFFFFFF), 16) ^
                HASH_ROL((unsigned) ((size_t) &var & 0xFFFFFFFF), 24);
#endif
    }
}